

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

string * __thiscall Node::to_string_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  pointer pcVar3;
  size_type sVar4;
  Node *pNVar5;
  string *__return_storage_ptr___00;
  _Rb_tree_const_iterator<char> _Var6;
  size_type sVar7;
  initializer_list<char> __l;
  char c;
  undefined3 uStack_14f;
  undefined2 local_14c;
  undefined1 local_14a;
  Node *local_130;
  string *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string newLabel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  set<char,_std::less<char>,_std::allocator<char>_> escapeChars;
  
  newLabel._M_dataplus._M_p = (pointer)&newLabel.field_2;
  newLabel._M_string_length = 0;
  newLabel.field_2._M_local_buf[0] = '\0';
  _c = 0x3b227d7b;
  local_14c = 0x2928;
  local_14a = 10;
  __l._M_len = 7;
  __l._M_array = &c;
  local_128 = __return_storage_ptr__;
  std::set<char,_std::less<char>,_std::allocator<char>_>::set
            (&escapeChars,__l,(less<char> *)&local_100,(allocator_type *)&local_120);
  pcVar3 = (this->label)._M_dataplus._M_p;
  sVar4 = (this->label)._M_string_length;
  p_Var1 = &escapeChars._M_t._M_impl.super__Rb_tree_header;
  local_130 = this;
  for (sVar7 = 0; pNVar5 = local_130, sVar4 != sVar7; sVar7 = sVar7 + 1) {
    cVar2 = pcVar3[sVar7];
    _c = CONCAT31(uStack_14f,cVar2);
    if (cVar2 != '\n') {
      if (cVar2 == '#') {
        _c = CONCAT31(uStack_14f,0x5f);
      }
      _Var6 = std::
              __find_if<std::_Rb_tree_const_iterator<char>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (escapeChars._M_t._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1,&c)
      ;
      if ((_Rb_tree_header *)_Var6._M_node != p_Var1) {
        std::__cxx11::string::push_back((char)&newLabel);
      }
      std::__cxx11::string::push_back((char)&newLabel);
    }
  }
  std::operator+(&local_c0,&local_130->name,"[label=\"");
  std::operator+(&local_a0,&local_c0,&newLabel);
  __return_storage_ptr___00 = local_128;
  std::operator+(&local_80,&local_a0,"\" shape=");
  std::operator+(&local_120,&local_80,&pNVar5->shape);
  std::operator+(&local_100,&local_120," ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,&local_100,
                 &pNVar5->extra);
  std::operator+(__return_storage_ptr___00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,"]");
  std::__cxx11::string::~string((string *)&c);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&escapeChars._M_t);
  std::__cxx11::string::~string((string *)&newLabel);
  return __return_storage_ptr___00;
}

Assistant:

string Node::to_string() {
    std::string newLabel;
    std::set<char> escapeChars = {'{', '}', '"', ';', '(', ')', '\n'};
    int i = 0;
    for (char c: label) {
        i++;
        if (c == '\n')
            continue;
        if (c == '#')
            c = '_';
        if (std::find(escapeChars.begin(), escapeChars.end(), c) != escapeChars.end()) {
            newLabel += '\\';
        }
        newLabel += c;
    }
    string str = name + "[label=\"" + newLabel + "\" shape=" + shape + " " + extra + "]";
    return str;
}